

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void recomputeColumnsUsed(Select *pSelect,SrcItem *pSrcItem)

{
  undefined1 local_48 [8];
  Walker w;
  SrcItem *pSrcItem_local;
  Select *pSelect_local;
  
  if (pSrcItem->pTab != (Table *)0x0) {
    w.u.pSrcItem = pSrcItem;
    memset(local_48,0,0x30);
    w.pParse = (Parse *)recomputeColumnsUsedExpr;
    w.xExprCallback = sqlite3SelectWalkNoop;
    w._32_8_ = w.u;
    (w.u.pSrcList)->a[0].u3.pOn = (Expr *)0x0;
    sqlite3WalkSelect((Walker *)local_48,pSelect);
  }
  return;
}

Assistant:

static void recomputeColumnsUsed(
  Select *pSelect,                 /* The complete SELECT statement */
  SrcItem *pSrcItem                /* Which FROM clause item to recompute */
){
  Walker w;
  if( NEVER(pSrcItem->pTab==0) ) return;
  memset(&w, 0, sizeof(w));
  w.xExprCallback = recomputeColumnsUsedExpr;
  w.xSelectCallback = sqlite3SelectWalkNoop;
  w.u.pSrcItem = pSrcItem;
  pSrcItem->colUsed = 0;
  sqlite3WalkSelect(&w, pSelect);
}